

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O1

void __thiscall
ProblemFOBSFireFightingFactored::ProblemFOBSFireFightingFactored
          (ProblemFOBSFireFightingFactored *this,void **vtt,size_t nrAgents,size_t nrHouses,
          size_t nrFLs,double costOfMove,bool forcePositionRepres,bool initialize)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  string local_90;
  string local_70;
  string local_50;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess =
       pvVar1;
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar1 + -0x58)) = vtt[0x1d];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0x1e];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x68)) = vtt[0x1f];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x70)) = vtt[0x20];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0x21];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x50)) = vtt[0x22];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x23];
  *(void **)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
             super_MultiAgentDecisionProcessDiscreteFactoredStates.field_0x600 = vtt[0x24];
  (**(code **)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x328))(&local_50,this,nrAgents,nrHouses)
  ;
  (**(code **)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x330))
            (&local_70,this,nrAgents,nrHouses,nrFLs);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"none","");
  FactoredMMDPDiscrete::FactoredMMDPDiscrete
            (&this->super_FactoredMMDPDiscrete,vtt + 1,&local_50,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pvVar1 = *vtt;
  *(void **)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess =
       pvVar1;
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar1 + -0x58)) = vtt[0x1d];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0x1e];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x68)) = vtt[0x1f];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x70)) = vtt[0x20];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0x21];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x50)) = vtt[0x22];
  *(void **)(&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x23];
  *(void **)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
             super_MultiAgentDecisionProcessDiscreteFactoredStates.field_0x600 = vtt[0x24];
  *(size_t *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.field_0x708 =
       nrAgents;
  *(size_t *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.field_0x710 =
       nrHouses;
  this->_m_nrFireLevels = nrFLs;
  this->_m_costOfMove = costOfMove;
  this->_m_forcePositionRepres = forcePositionRepres;
  auVar2 = ZEXT816(0) << 0x20;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._0_8_;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)auVar2._8_8_;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._0_8_;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar2._8_8_;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (initialize) {
    InitializePFFF(this);
  }
  return;
}

Assistant:

ProblemFOBSFireFightingFactored::ProblemFOBSFireFightingFactored(
    size_t nrAgents, size_t nrHouses, size_t nrFLs,
    double costOfMove, bool forcePositionRepres, bool initialize)
        :
        FactoredMMDPDiscrete(
            SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs),
            SoftPrintDescription(nrAgents, nrHouses, nrFLs),
            "none"),
        _m_nrAgents(nrAgents),
        _m_nrHouses(nrHouses),
        _m_nrFireLevels(nrFLs),
        _m_costOfMove(costOfMove),
        _m_forcePositionRepres(forcePositionRepres)
{
    if(initialize)
        InitializePFFF();
}